

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

BOOL __thiscall
Js::RecyclableCollectionObjectWalker<Js::JavascriptWeakMap>::Get
          (RecyclableCollectionObjectWalker<Js::JavascriptWeakMap> *this,int i,
          ResolvedObject *pResolvedObject)

{
  StringBuilder<Memory::ArenaAllocator> *this_00;
  Var aValue;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  char16 *pcVar4;
  undefined4 *puVar5;
  RecyclableObject *this_01;
  IDiagObjectModelDisplay *pIVar6;
  Type TVar7;
  
  this_00 = this->scriptContext->threadContext->debugManager->pCurrentInterpreterLocation->
            stringBuilder;
  this_00->length = 0;
  this_00->count = 0;
  this_00->firstChunk = (Data *)0x0;
  this_00->secondChunk = (Data *)0x0;
  this_00->lastChunk = (Data *)0x0;
  StringBuilder<Memory::ArenaAllocator>::AppendUint64(this_00,(long)i);
  pcVar4 = StringBuilder<Memory::ArenaAllocator>::Detach(this_00);
  pResolvedObject->name = pcVar4;
  pResolvedObject->propId = -1;
  aValue = this->instance;
  pResolvedObject->obj = aValue;
  pResolvedObject->scriptContext = this->scriptContext;
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_008c074e;
    *puVar5 = 0;
LAB_008c062a:
    this_01 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this_01 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_008c074e;
      *puVar5 = 0;
    }
    TVar7 = ((this_01->type).ptr)->typeId;
    if ((int)TVar7 < 0x58) goto LAB_008c071c;
    BVar3 = RecyclableObject::IsExternal(this_01);
    if (BVar3 != 0) goto LAB_008c071c;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar2) {
LAB_008c074e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  else {
    if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
      TVar7 = TypeIds_FirstNumberType;
      if ((((ulong)aValue & 0xffff000000000000) == 0x1000000000000) ||
         (TVar7 = TypeIds_Number, (ulong)aValue >> 0x32 != 0)) goto LAB_008c071c;
      goto LAB_008c062a;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_008c074e;
    TVar7 = TypeIds_FirstNumberType;
  }
  *puVar5 = 0;
LAB_008c071c:
  pResolvedObject->typeId = TVar7;
  pResolvedObject->address = (IDiagObjectAddress *)0x0;
  pIVar6 = CreateTDataDisplay(this,pResolvedObject,i);
  pResolvedObject->objectDisplay = pIVar6;
  return 1;
}

Assistant:

BOOL RecyclableCollectionObjectWalker<TData>::Get(int i, ResolvedObject* pResolvedObject)
    {
        auto builder = scriptContext->GetThreadContext()->GetDebugManager()->pCurrentInterpreterLocation->stringBuilder;
        builder->Reset();
        builder->AppendUint64(i);
        pResolvedObject->name = builder->Detach();
        pResolvedObject->propId = Constants::NoProperty;
        pResolvedObject->obj = instance;
        pResolvedObject->scriptContext = scriptContext;
        pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);
        pResolvedObject->address = nullptr;

        pResolvedObject->objectDisplay = CreateTDataDisplay(pResolvedObject, i);

        return TRUE;
    }